

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this)

{
  int iVar1;
  RecyclableObject *key;
  List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pRVar2;
  bool bVar3;
  JavascriptWeakMap *this_01;
  WeakMapKeyMap *this_02;
  int iVar4;
  int i;
  void *local_68;
  void *local_60;
  Var local_58;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *local_50;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *local_48;
  Var local_40;
  Var value;
  
  local_48 = this;
  this_01 = VarTo<Js::JavascriptWeakMap>(this->instance);
  if ((this_01->keySet).
      super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      .bucketCount != 0) {
    local_50 = &(this_01->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ;
    local_60 = (void *)((ulong)this_01 | 1);
    value = (Var)0x0;
    do {
      i = (this_01->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[(long)value];
      if (i != -1) {
        iVar4 = -1;
        do {
          key = (this_01->keySet).
                super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                .weakRefs.ptr[i].ptr;
          if (key == (RecyclableObject *)0x0) {
            iVar1 = (this_01->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(local_50,i,iVar4,(uint)value);
          }
          else {
            local_40 = (Var)0x0;
            this_02 = JavascriptWeakMap::GetWeakMapKeyMapFromKey(this_01,key);
            if (this_02 != (WeakMapKeyMap *)0x0) {
              local_68 = local_60;
              bVar3 = JsUtil::
                      BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey(this_02,&local_68);
              if (bVar3) {
                JavascriptWeakMap::KeyMapGet(this_01,this_02,&local_40);
                local_58 = local_40;
                this_00 = local_48->propertyList;
                JsUtil::
                List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::EnsureArray(this_00,0);
                pRVar2 = (this_00->
                         super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
                         ).buffer;
                iVar4 = (this_00->
                        super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
                        ).count;
                pRVar2[iVar4].key = key;
                pRVar2[iVar4].value = local_58;
                (this_00->
                super_ReadOnlyList<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakMap>,_Memory::ArenaAllocator,_DefaultComparer>
                ).count = iVar4 + 1;
              }
            }
            iVar1 = (this_01->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            iVar4 = i;
          }
          i = iVar1;
        } while (i != -1);
      }
      value = (Var)((long)value + 1);
    } while (value < (Var)(ulong)(this_01->keySet).
                                 super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                                 .bucketCount);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakMap>::GetChildren()
    {
        JavascriptWeakMap* data = VarTo<JavascriptWeakMap>(instance);
        data->Map([&](Var key, Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakMap>(key, value));
        });
    }